

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O1

opj_image_t * bmptoimage(char *filename,opj_cparameters_t *parameters)

{
  ushort uVar1;
  OPJ_UINT32 OVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  OPJ_BOOL OVar18;
  FILE *__stream;
  size_t sVar19;
  OPJ_UINT8 *pOVar20;
  opj_image_t *image;
  byte bVar21;
  char cVar22;
  long lVar23;
  OPJ_UINT32 OVar24;
  undefined8 in_R8;
  ulong uVar25;
  OPJ_BITMAPINFOHEADER Info_h;
  OPJ_UINT8 *pLUT [3];
  opj_image_cmptparm_t cmptparm [4];
  OPJ_UINT8 lut_B [256];
  OPJ_UINT8 lut_G [256];
  OPJ_UINT8 lut_R [256];
  uint uStack_450;
  uint uStack_44c;
  uint local_448;
  uint uStack_444;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  uint uStack_410;
  uint uStack_40c;
  uint uStack_408;
  undefined8 uStack_404;
  OPJ_UINT8 *local_3f0;
  undefined8 local_3e8;
  undefined8 local_3e0;
  byte *local_3d8;
  undefined8 uStack_3d0;
  undefined4 local_3c8 [36];
  byte local_338 [256];
  byte local_238 [256];
  byte local_138 [264];
  
  local_3e8 = local_138;
  local_3e0 = local_238;
  local_3d8 = local_338;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Failed to open %s for reading !!\n",filename);
    return (opj_image_t *)0x0;
  }
  uVar4 = getc(__stream);
  iVar5 = getc(__stream);
  if (((iVar5 << 8 | uVar4) & 0xffff) == 0x4d42) {
    getc(__stream);
    getc(__stream);
    getc(__stream);
    getc(__stream);
    getc(__stream);
    getc(__stream);
    getc(__stream);
    getc(__stream);
    uVar6 = getc(__stream);
    iVar5 = getc(__stream);
    iVar7 = getc(__stream);
    iVar8 = getc(__stream);
    uStack_408 = 0;
    uStack_404 = 0;
    local_418 = 0;
    uStack_410 = 0;
    uStack_40c = 0;
    local_428 = 0;
    uStack_420 = 0;
    local_438 = 0;
    uStack_430 = 0;
    local_448 = 0;
    uStack_444 = 0;
    uStack_440 = 0;
    uVar16 = 0;
    uStack_450 = 0;
    uStack_44c = 0;
    uVar4 = 0;
    uVar9 = getc(__stream);
    iVar10 = getc(__stream);
    iVar11 = getc(__stream);
    iVar12 = getc(__stream);
    uVar9 = iVar12 << 0x18 | uVar9 | iVar10 << 8 | iVar11 << 0x10;
    if ((((uVar9 < 0x39) && ((0x110010000001000U >> ((ulong)uVar9 & 0x3f) & 1) != 0)) ||
        (uVar9 == 0x6c)) || (uVar9 == 0x7c)) {
      uVar13 = getc(__stream);
      iVar10 = getc(__stream);
      iVar11 = getc(__stream);
      iVar12 = getc(__stream);
      uVar13 = uVar13 | iVar10 << 8 | iVar11 << 0x10 | iVar12 << 0x18;
      uVar14 = getc(__stream);
      iVar10 = getc(__stream);
      iVar11 = getc(__stream);
      iVar12 = getc(__stream);
      uVar14 = uVar14 | iVar10 << 8 | iVar11 << 0x10 | iVar12 << 0x18;
      getc(__stream);
      getc(__stream);
      iVar10 = getc(__stream);
      iVar11 = getc(__stream);
      uVar1 = (ushort)iVar10 | (ushort)(iVar11 << 8);
      if (uVar1 == 0) {
        bmptoimage_cold_8();
      }
      else {
        if (0x27 < uVar9) {
          uVar4 = getc(__stream);
          iVar11 = getc(__stream);
          iVar12 = getc(__stream);
          iVar15 = getc(__stream);
          uVar4 = uVar4 | iVar11 << 8 | iVar12 << 0x10 | iVar15 << 0x18;
          getc(__stream);
          getc(__stream);
          getc(__stream);
          getc(__stream);
          getc(__stream);
          getc(__stream);
          getc(__stream);
          getc(__stream);
          getc(__stream);
          getc(__stream);
          getc(__stream);
          getc(__stream);
          uVar16 = getc(__stream);
          iVar11 = getc(__stream);
          iVar12 = getc(__stream);
          iVar15 = getc(__stream);
          uVar16 = uVar16 | iVar11 << 8 | iVar12 << 0x10 | iVar15 << 0x18;
          getc(__stream);
          getc(__stream);
          getc(__stream);
          getc(__stream);
        }
        if (0x37 < uVar9) {
          uVar17 = getc(__stream);
          iVar11 = getc(__stream);
          iVar12 = getc(__stream);
          iVar15 = getc(__stream);
          uStack_450 = uVar17 | iVar11 << 8 | iVar12 << 0x10 | iVar15 << 0x18;
          if (uStack_450 == 0) {
            bmptoimage_cold_7();
            goto LAB_0010d2d7;
          }
          uVar17 = getc(__stream);
          iVar11 = getc(__stream);
          iVar12 = getc(__stream);
          iVar15 = getc(__stream);
          uStack_44c = uVar17 | iVar11 << 8 | iVar12 << 0x10 | iVar15 << 0x18;
          if (uStack_44c == 0) {
            bmptoimage_cold_6();
            goto LAB_0010d2d7;
          }
          uVar17 = getc(__stream);
          iVar11 = getc(__stream);
          iVar12 = getc(__stream);
          iVar15 = getc(__stream);
          local_448 = uVar17 | iVar11 << 8 | iVar12 << 0x10 | iVar15 << 0x18;
          if (local_448 == 0) {
            bmptoimage_cold_5();
            goto LAB_0010d2d7;
          }
          uVar17 = getc(__stream);
          iVar11 = getc(__stream);
          iVar12 = getc(__stream);
          iVar15 = getc(__stream);
          uStack_444 = uVar17 | iVar11 << 8 | iVar12 << 0x10 | iVar15 << 0x18;
        }
        if (0x6b < uVar9) {
          uVar17 = getc(__stream);
          uStack_440._0_4_ = uVar17;
          iVar11 = getc(__stream);
          uStack_440._0_4_ = (uint)uStack_440 | iVar11 << 8;
          iVar11 = getc(__stream);
          uStack_440._0_4_ = (uint)uStack_440 | iVar11 << 0x10;
          iVar11 = getc(__stream);
          uStack_440 = CONCAT44(uStack_440._4_4_,(uint)uStack_440 | iVar11 << 0x18);
          sVar19 = fread((void *)((long)&uStack_440 + 4),1,0x24,__stream);
          if (sVar19 != 0x24) {
            bmptoimage_cold_2();
            goto LAB_0010d2d7;
          }
          uVar17 = getc(__stream);
          local_418._0_4_ = uVar17;
          iVar11 = getc(__stream);
          local_418._0_4_ = (uint)local_418 | iVar11 << 8;
          iVar11 = getc(__stream);
          local_418._0_4_ = (uint)local_418 | iVar11 << 0x10;
          iVar11 = getc(__stream);
          local_418 = CONCAT44(local_418._4_4_,(uint)local_418 | iVar11 << 0x18);
          uVar17 = getc(__stream);
          local_418._4_4_ = uVar17;
          iVar11 = getc(__stream);
          local_418._4_4_ = local_418._4_4_ | iVar11 << 8;
          iVar11 = getc(__stream);
          local_418._4_4_ = local_418._4_4_ | iVar11 << 0x10;
          iVar11 = getc(__stream);
          local_418 = CONCAT44(local_418._4_4_ | iVar11 << 0x18,(uint)local_418);
          uStack_410 = getc(__stream);
          iVar11 = getc(__stream);
          uStack_410 = uStack_410 | iVar11 << 8;
          iVar11 = getc(__stream);
          uStack_410 = uStack_410 | iVar11 << 0x10;
          iVar11 = getc(__stream);
          uStack_410 = uStack_410 | iVar11 << 0x18;
        }
        if (0x7b < uVar9) {
          uStack_40c = getc(__stream);
          iVar11 = getc(__stream);
          uStack_40c = uStack_40c | iVar11 << 8;
          iVar11 = getc(__stream);
          uStack_40c = uStack_40c | iVar11 << 0x10;
          iVar11 = getc(__stream);
          uStack_40c = uStack_40c | iVar11 << 0x18;
          uStack_408 = getc(__stream);
          iVar11 = getc(__stream);
          uStack_408 = uStack_408 | iVar11 << 8;
          iVar11 = getc(__stream);
          uStack_408 = uStack_408 | iVar11 << 0x10;
          iVar11 = getc(__stream);
          uStack_408 = uStack_408 | iVar11 << 0x18;
          uVar9 = getc(__stream);
          uStack_404._0_4_ = uVar9;
          iVar11 = getc(__stream);
          uStack_404._0_4_ = (uint)uStack_404 | iVar11 << 8;
          iVar11 = getc(__stream);
          uStack_404._0_4_ = (uint)uStack_404 | iVar11 << 0x10;
          iVar11 = getc(__stream);
          uStack_404 = CONCAT44(uStack_404._4_4_,(uint)uStack_404 | iVar11 << 0x18);
          uVar9 = getc(__stream);
          uStack_404._4_4_ = uVar9;
          iVar11 = getc(__stream);
          uStack_404._4_4_ = uStack_404._4_4_ | iVar11 << 8;
          iVar11 = getc(__stream);
          uStack_404._4_4_ = uStack_404._4_4_ | iVar11 << 0x10;
          iVar11 = getc(__stream);
          uStack_404 = CONCAT44(uStack_404._4_4_ | iVar11 << 0x18,(uint)uStack_404);
        }
        OVar24 = (OPJ_UINT32)in_R8;
        if (uVar1 < 9) {
          uVar25 = 0;
          memset(local_138,0,0x100);
          memset(local_238,0,0x100);
          memset(local_338,0,0x100);
          uVar9 = 1 << ((byte)iVar10 & 0x1f);
          if (uVar16 != 0) {
            uVar9 = uVar16;
          }
          if (0xff < uVar9) {
            uVar9 = 0x100;
          }
          bVar21 = 0;
          do {
            iVar10 = getc(__stream);
            local_338[uVar25] = (byte)iVar10;
            iVar10 = getc(__stream);
            local_238[uVar25] = (byte)iVar10;
            iVar10 = getc(__stream);
            local_138[uVar25] = (byte)iVar10;
            getc(__stream);
            OVar24 = (OPJ_UINT32)in_R8;
            bVar21 = local_238[uVar25] ^ local_138[uVar25] |
                     local_338[uVar25] ^ local_238[uVar25] | bVar21;
            uVar25 = uVar25 + 1;
          } while (uVar9 + (uVar9 == 0) != uVar25);
          cVar22 = (bVar21 != 0) * '\x02' + '\x01';
        }
        else {
          cVar22 = (uStack_444 != 0 && uVar4 == 3) + '\x03';
        }
        if ((uVar14 != 0 && uVar13 != 0) && ((uint)uVar1 <= (uint)(0xffffffe0 / (ulong)uVar13))) {
          uVar16 = uVar13 * uVar1 + 0x1f >> 3;
          if ((uVar1 == 4) && (uVar4 == 2)) {
            if (0x1ffffffc < uVar13) goto LAB_0010d2d7;
            uVar16 = uVar13 + 3;
          }
          uVar16 = uVar16 & 0x1ffffffc;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = CONCAT44(0,uVar14);
          if ((uVar16 <= SUB164((ZEXT816(0) << 0x40 | ZEXT816(0xffffffff)) / auVar3,0)) &&
             (pOVar20 = (OPJ_UINT8 *)calloc(1,CONCAT44(0,uVar14) * (ulong)uVar16),
             pOVar20 != (OPJ_UINT8 *)0x0)) {
            OVar18 = 0;
            local_3f0 = pOVar20;
            fseek(__stream,0,0);
            fseek(__stream,(ulong)(iVar8 << 0x18 | iVar7 << 0x10 | iVar5 << 8 | uVar6),0);
            switch(uVar4) {
            case 0:
            case 3:
              OVar18 = bmp_read_raw_data((FILE *)__stream,local_3f0,uVar16,uVar14,OVar24);
              break;
            case 1:
              OVar18 = bmp_read_rle8_data((FILE *)__stream,local_3f0,uVar16,uVar13,uVar14);
              break;
            case 2:
              OVar18 = bmp_read_rle4_data((FILE *)__stream,local_3f0,uVar16,uVar13,uVar14);
              break;
            default:
              bmptoimage_cold_3();
            }
            if (OVar18 != 0) {
              memset(local_3c8,0,0x90);
              pOVar20 = local_3f0;
              iVar5 = parameters->subsampling_dx;
              iVar7 = parameters->subsampling_dy;
              lVar23 = 0x20;
              do {
                *(undefined8 *)((long)&uStack_3d0 + lVar23) = 0x800000008;
                *(undefined4 *)((long)local_3c8 + lVar23) = 0;
                *(int *)((long)&local_3e8 + lVar23) = iVar5;
                *(int *)((long)&local_3e8 + lVar23 + 4) = iVar7;
                *(uint *)((long)&local_3e0 + lVar23) = uVar13;
                *(uint *)((long)&local_3e0 + lVar23 + 4) = uVar14;
                lVar23 = lVar23 + 0x24;
              } while (lVar23 != 0xb0);
              image = (opj_image_t *)opj_image_create(cVar22,local_3c8,(cVar22 == '\x01') + '\x01');
              if (image == (opj_image_t *)0x0) {
                fclose(__stream);
                free(pOVar20);
                return (opj_image_t *)0x0;
              }
              if (cVar22 == '\x04') {
                image->comps[3].alpha = 1;
              }
              OVar24 = parameters->image_offset_x0;
              image->x0 = OVar24;
              OVar2 = parameters->image_offset_y0;
              image->y0 = OVar2;
              image->x1 = OVar24 + (uVar13 - 1) * parameters->subsampling_dx + 1;
              image->y1 = (uVar14 - 1) * parameters->subsampling_dy + OVar2 + 1;
              if (uVar4 == 0 && uVar1 == 0x18) {
                bmp24toimage(pOVar20,uVar16,image);
              }
              else if (((uVar1 == 8 && uVar4 == 0) || (uVar4 == 1 && uVar1 == 8)) ||
                      (uVar4 == 2 && uVar1 == 4)) {
                bmp8toimage(pOVar20,uVar16,image,(OPJ_UINT8 **)&local_3e8);
              }
              else {
                if (uVar1 == 0x20 && uVar4 == 0) {
                  uStack_444 = 0;
                  uStack_450 = 0xff0000;
                  uStack_44c = 0xff00;
                  local_448 = 0xff;
                }
                else {
                  if (uVar4 != 3 || uVar1 != 0x20) {
                    if (uVar1 == 0x10 && uVar4 == 0) {
                      uStack_444 = 0;
                      uStack_450 = 0x7c00;
                      uStack_44c = 0x3e0;
                      local_448 = 0x1f;
                    }
                    else {
                      if ((uVar1 != 0x10) || (uVar4 != 3)) {
                        bmptoimage_cold_4();
                        image = (opj_image_t *)0x0;
                        pOVar20 = local_3f0;
                        goto LAB_0010d363;
                      }
                      pOVar20 = local_3f0;
                      if (((uStack_450 == 0) && (uStack_44c == 0)) && (local_448 == 0)) {
                        uStack_450 = 0xf800;
                        uStack_44c = 0x7e0;
                        local_448 = 0x1f;
                      }
                    }
                    bmpmask16toimage(pOVar20,uVar16,image,uStack_450,uStack_44c,local_448,uStack_444
                                    );
                    goto LAB_0010d363;
                  }
                  if (((uStack_450 == 0) && (uStack_44c == 0)) && (local_448 == 0)) {
                    uStack_450 = 0xff0000;
                    uStack_44c = 0xff00;
                    local_448 = 0xff;
                  }
                }
                bmpmask32toimage(pOVar20,uVar16,image,uStack_450,uStack_44c,local_448,uStack_444);
              }
LAB_0010d363:
              free(pOVar20);
              fclose(__stream);
              return image;
            }
            free(local_3f0);
          }
        }
      }
    }
    else {
      fprintf(_stderr,"Error, unknown BMP header size %d\n",(ulong)uVar9);
    }
  }
  else {
    bmptoimage_cold_1();
  }
LAB_0010d2d7:
  fclose(__stream);
  return (opj_image_t *)0x0;
}

Assistant:

opj_image_t* bmptoimage(const char *filename, opj_cparameters_t *parameters)
{
    opj_image_cmptparm_t cmptparm[4];   /* maximum of 4 components */
    OPJ_UINT8 lut_R[256], lut_G[256], lut_B[256];
    OPJ_UINT8 const* pLUT[3];
    opj_image_t * image = NULL;
    FILE *IN;
    OPJ_BITMAPFILEHEADER File_h;
    OPJ_BITMAPINFOHEADER Info_h;
    OPJ_UINT32 i, palette_len, numcmpts = 1U;
    OPJ_BOOL l_result = OPJ_FALSE;
    OPJ_UINT8* pData = NULL;
    OPJ_UINT32 stride;

    pLUT[0] = lut_R;
    pLUT[1] = lut_G;
    pLUT[2] = lut_B;

    IN = fopen(filename, "rb");
    if (!IN) {
        fprintf(stderr, "Failed to open %s for reading !!\n", filename);
        return NULL;
    }

    if (!bmp_read_file_header(IN, &File_h)) {
        fclose(IN);
        return NULL;
    }
    if (!bmp_read_info_header(IN, &Info_h)) {
        fclose(IN);
        return NULL;
    }

    /* Load palette */
    if (Info_h.biBitCount <= 8U) {
        memset(&lut_R[0], 0, sizeof(lut_R));
        memset(&lut_G[0], 0, sizeof(lut_G));
        memset(&lut_B[0], 0, sizeof(lut_B));

        palette_len = Info_h.biClrUsed;
        if ((palette_len == 0U) && (Info_h.biBitCount <= 8U)) {
            palette_len = (1U << Info_h.biBitCount);
        }
        if (palette_len > 256U) {
            palette_len = 256U;
        }
        if (palette_len > 0U) {
            OPJ_UINT8 has_color = 0U;
            for (i = 0U; i < palette_len; i++) {
                lut_B[i] = (OPJ_UINT8)getc(IN);
                lut_G[i] = (OPJ_UINT8)getc(IN);
                lut_R[i] = (OPJ_UINT8)getc(IN);
                (void)getc(IN); /* padding */
                has_color |= (lut_B[i] ^ lut_G[i]) | (lut_G[i] ^ lut_R[i]);
            }
            if (has_color) {
                numcmpts = 3U;
            }
        }
    } else {
        numcmpts = 3U;
        if ((Info_h.biCompression == 3) && (Info_h.biAlphaMask != 0U)) {
            numcmpts++;
        }
    }

    if (Info_h.biWidth == 0 || Info_h.biHeight == 0) {
        fclose(IN);
        return NULL;
    }

    if (Info_h.biBitCount > (((OPJ_UINT32) - 1) - 31) / Info_h.biWidth) {
        fclose(IN);
        return NULL;
    }
    stride = ((Info_h.biWidth * Info_h.biBitCount + 31U) / 32U) *
             4U; /* rows are aligned on 32bits */
    if (Info_h.biBitCount == 4 &&
            Info_h.biCompression == 2) { /* RLE 4 gets decoded as 8 bits data for now... */
        if (8 > (((OPJ_UINT32) - 1) - 31) / Info_h.biWidth) {
            fclose(IN);
            return NULL;
        }
        stride = ((Info_h.biWidth * 8U + 31U) / 32U) * 4U;
    }

    if (stride > ((OPJ_UINT32) - 1) / sizeof(OPJ_UINT8) / Info_h.biHeight) {
        fclose(IN);
        return NULL;
    }
    pData = (OPJ_UINT8 *) calloc(1, sizeof(OPJ_UINT8) * stride * Info_h.biHeight);
    if (pData == NULL) {
        fclose(IN);
        return NULL;
    }
    /* Place the cursor at the beginning of the image information */
    fseek(IN, 0, SEEK_SET);
    fseek(IN, (long)File_h.bfOffBits, SEEK_SET);

    switch (Info_h.biCompression) {
    case 0:
    case 3:
        /* read raw data */
        l_result = bmp_read_raw_data(IN, pData, stride, Info_h.biWidth,
                                     Info_h.biHeight);
        break;
    case 1:
        /* read rle8 data */
        l_result = bmp_read_rle8_data(IN, pData, stride, Info_h.biWidth,
                                      Info_h.biHeight);
        break;
    case 2:
        /* read rle4 data */
        l_result = bmp_read_rle4_data(IN, pData, stride, Info_h.biWidth,
                                      Info_h.biHeight);
        break;
    default:
        fprintf(stderr, "Unsupported BMP compression\n");
        l_result = OPJ_FALSE;
        break;
    }
    if (!l_result) {
        free(pData);
        fclose(IN);
        return NULL;
    }

    /* create the image */
    memset(&cmptparm[0], 0, sizeof(cmptparm));
    for (i = 0; i < 4U; i++) {
        cmptparm[i].prec = 8;
        cmptparm[i].bpp  = 8;
        cmptparm[i].sgnd = 0;
        cmptparm[i].dx   = (OPJ_UINT32)parameters->subsampling_dx;
        cmptparm[i].dy   = (OPJ_UINT32)parameters->subsampling_dy;
        cmptparm[i].w    = Info_h.biWidth;
        cmptparm[i].h    = Info_h.biHeight;
    }

    image = opj_image_create(numcmpts, &cmptparm[0],
                             (numcmpts == 1U) ? OPJ_CLRSPC_GRAY : OPJ_CLRSPC_SRGB);
    if (!image) {
        fclose(IN);
        free(pData);
        return NULL;
    }
    if (numcmpts == 4U) {
        image->comps[3].alpha = 1;
    }

    /* set image offset and reference grid */
    image->x0 = (OPJ_UINT32)parameters->image_offset_x0;
    image->y0 = (OPJ_UINT32)parameters->image_offset_y0;
    image->x1 = image->x0 + (Info_h.biWidth  - 1U) * (OPJ_UINT32)
                parameters->subsampling_dx + 1U;
    image->y1 = image->y0 + (Info_h.biHeight - 1U) * (OPJ_UINT32)
                parameters->subsampling_dy + 1U;

    /* Read the data */
    if (Info_h.biBitCount == 24 && Info_h.biCompression == 0) { /*RGB */
        bmp24toimage(pData, stride, image);
    } else if (Info_h.biBitCount == 8 &&
               Info_h.biCompression == 0) { /* RGB 8bpp Indexed */
        bmp8toimage(pData, stride, image, pLUT);
    } else if (Info_h.biBitCount == 8 && Info_h.biCompression == 1) { /*RLE8*/
        bmp8toimage(pData, stride, image, pLUT);
    } else if (Info_h.biBitCount == 4 && Info_h.biCompression == 2) { /*RLE4*/
        bmp8toimage(pData, stride, image,
                    pLUT); /* RLE 4 gets decoded as 8 bits data for now */
    } else if (Info_h.biBitCount == 32 && Info_h.biCompression == 0) { /* RGBX */
        bmpmask32toimage(pData, stride, image, 0x00FF0000U, 0x0000FF00U, 0x000000FFU,
                         0x00000000U);
    } else if (Info_h.biBitCount == 32 && Info_h.biCompression == 3) { /* bitmask */
        if ((Info_h.biRedMask == 0U) && (Info_h.biGreenMask == 0U) &&
                (Info_h.biBlueMask == 0U)) {
            Info_h.biRedMask   = 0x00FF0000U;
            Info_h.biGreenMask = 0x0000FF00U;
            Info_h.biBlueMask  = 0x000000FFU;
        }
        bmpmask32toimage(pData, stride, image, Info_h.biRedMask, Info_h.biGreenMask,
                         Info_h.biBlueMask, Info_h.biAlphaMask);
    } else if (Info_h.biBitCount == 16 && Info_h.biCompression == 0) { /* RGBX */
        bmpmask16toimage(pData, stride, image, 0x7C00U, 0x03E0U, 0x001FU, 0x0000U);
    } else if (Info_h.biBitCount == 16 && Info_h.biCompression == 3) { /* bitmask */
        if ((Info_h.biRedMask == 0U) && (Info_h.biGreenMask == 0U) &&
                (Info_h.biBlueMask == 0U)) {
            Info_h.biRedMask   = 0xF800U;
            Info_h.biGreenMask = 0x07E0U;
            Info_h.biBlueMask  = 0x001FU;
        }
        bmpmask16toimage(pData, stride, image, Info_h.biRedMask, Info_h.biGreenMask,
                         Info_h.biBlueMask, Info_h.biAlphaMask);
    } else {
        opj_image_destroy(image);
        image = NULL;
        fprintf(stderr,
                "Other system than 24 bits/pixels or 8 bits (no RLE coding) is not yet implemented [%d]\n",
                Info_h.biBitCount);
    }
    free(pData);
    fclose(IN);
    return image;
}